

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

void bench_ecmult_teardown_helper
               (bench_data *data,size_t *seckey_offset,size_t *scalar_offset,
               size_t *scalar_gen_offset,int iters)

{
  uint64_t *puVar1;
  secp256k1_fe *rzr;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_scalar local_1d8;
  secp256k1_scalar s;
  int local_140;
  secp256k1_gej sum_output;
  secp256k1_gej tmp;
  
  sum_output.infinity = 1;
  sum_output.x.n[0] = 0;
  sum_output.x.n[1] = 0;
  sum_output.x.n[2] = 0;
  sum_output.x.n[3] = 0;
  sum_output.x.n[4] = 0;
  sum_output.y.n[0] = 0;
  sum_output.y.n[1] = 0;
  sum_output.y.n[2] = 0;
  sum_output.y.n[3] = 0;
  sum_output.y.n[4] = 0;
  sum_output.z.n[4] = 0;
  sum_output.z.n[0] = 0;
  sum_output.z.n[1] = 0;
  sum_output.z.n[2] = 0;
  sum_output.z.n[3] = 0;
  uVar2 = 0;
  uVar5 = (ulong)(uint)iters;
  if (iters < 1) {
    uVar5 = uVar2;
  }
  local_1d8.d[0] = 0;
  local_1d8.d[1] = 0;
  local_1d8.d[2] = 0;
  local_1d8.d[3] = 0;
  rzr = (secp256k1_fe *)scalar_gen_offset;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    secp256k1_gej_add_var
              (&sum_output,&sum_output,(secp256k1_gej *)((long)(data->output->x).n + uVar2),rzr);
    iVar3 = (int)uVar4;
    if (scalar_gen_offset != (size_t *)0x0) {
      secp256k1_scalar_add
                (&local_1d8,&local_1d8,
                 (secp256k1_scalar *)
                 ((long)data->scalars->d + (ulong)(((int)*scalar_gen_offset + iVar3 & 0x7fffU) << 5)
                 ));
    }
    if (seckey_offset != (size_t *)0x0) {
      rzr = (secp256k1_fe *)(ulong)(((int)*seckey_offset + iVar3 & 0x7fffU) << 5);
      puVar1 = (uint64_t *)((long)rzr->n + (long)data->seckeys->d);
      s.d[0] = *puVar1;
      s.d[1] = puVar1[1];
      puVar1 = (uint64_t *)((long)(data->seckeys->d + 2) + (long)rzr);
      s.d[2] = *puVar1;
      s.d[3] = puVar1[1];
      secp256k1_scalar_mul
                (&s,&s,(secp256k1_scalar *)
                       ((long)data->scalars->d +
                       (ulong)(((int)*scalar_offset + iVar3 & 0x7fffU) << 5)));
      secp256k1_scalar_add(&local_1d8,&local_1d8,&s);
    }
    uVar2 = uVar2 + 0x80;
  }
  secp256k1_ecmult_gen(&data->ctx->ecmult_gen_ctx,&tmp,&local_1d8);
  secp256k1_gej_neg((secp256k1_gej *)&s,&tmp);
  secp256k1_gej_add_var((secp256k1_gej *)&s,(secp256k1_gej *)&s,&sum_output,rzr);
  if (local_140 != 0) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_ecmult.c"
          ,0x58,"test condition failed: secp256k1_gej_eq_var(&tmp, &sum_output)");
  abort();
}

Assistant:

static void bench_ecmult_teardown_helper(bench_data* data, size_t* seckey_offset, size_t* scalar_offset, size_t* scalar_gen_offset, int iters) {
    int i;
    secp256k1_gej sum_output, tmp;
    secp256k1_scalar sum_scalars;

    secp256k1_gej_set_infinity(&sum_output);
    secp256k1_scalar_set_int(&sum_scalars, 0);
    for (i = 0; i < iters; ++i) {
        secp256k1_gej_add_var(&sum_output, &sum_output, &data->output[i], NULL);
        if (scalar_gen_offset != NULL) {
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &data->scalars[(*scalar_gen_offset+i) % POINTS]);
        }
        if (seckey_offset != NULL) {
            secp256k1_scalar s = data->seckeys[(*seckey_offset+i) % POINTS];
            secp256k1_scalar_mul(&s, &s, &data->scalars[(*scalar_offset+i) % POINTS]);
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &s);
        }
    }
    secp256k1_ecmult_gen(&data->ctx->ecmult_gen_ctx, &tmp, &sum_scalars);
    CHECK(secp256k1_gej_eq_var(&tmp, &sum_output));
}